

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O1

int libssh2_session_handshake(LIBSSH2_SESSION *session,libssh2_socket_t sock)

{
  uchar *puVar1;
  size_t *psVar2;
  uint uVar3;
  int iVar4;
  uint32_t uVar5;
  ssize_t sVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  size_t sVar10;
  char local_75;
  libssh2_socket_t local_74;
  uchar **local_70;
  packet_require_state_t *local_68;
  size_t *local_60;
  uchar *local_58;
  uchar *local_50;
  uchar *local_48;
  key_exchange_state_t *local_40;
  time_t local_38;
  
  local_74 = sock;
  local_38 = time((time_t *)0x0);
  local_40 = &session->startup_key_state;
  local_48 = session->startup_service + 1;
  local_50 = session->startup_service + 5;
  local_58 = session->startup_service;
  local_70 = &session->startup_data;
  local_60 = &session->startup_data_len;
  local_68 = &session->startup_req_state;
  do {
    if (session->startup_state == libssh2_NB_state_idle) {
      if (local_74 != -1) {
        session->socket_fd = local_74;
        uVar3 = fcntl(local_74,3,0);
        uVar3 = uVar3 >> 0xb & 1;
        session->socket_prev_blockstate = uVar3 ^ 1;
        if (uVar3 == 0) {
          iVar4 = session->socket_fd;
          uVar3 = fcntl(iVar4,3,0);
          iVar4 = fcntl(iVar4,4,(ulong)(uVar3 | 0x800));
          if (iVar4 != 0) {
            pcVar9 = "Failed changing socket\'s blocking state to non-blocking";
            goto LAB_00112792;
          }
        }
        session->startup_state = libssh2_NB_state_created;
        goto LAB_00112236;
      }
      iVar4 = -0x2d;
      pcVar9 = "Bad socket provided";
LAB_00112792:
      iVar4 = _libssh2_error(session,iVar4,pcVar9);
    }
    else {
LAB_00112236:
      if (session->startup_state == libssh2_NB_state_created) {
        sVar10 = 0x1c;
        pcVar9 = "SSH-2.0-libssh2_1.11.1_DEV\r\n";
        if (session->banner_TxRx_state == libssh2_NB_state_idle) {
          pcVar9 = (char *)(session->local).banner;
          if ((uchar *)pcVar9 == (uchar *)0x0) {
            pcVar9 = "SSH-2.0-libssh2_1.11.1_DEV\r\n";
          }
          else {
            sVar10 = strlen(pcVar9);
          }
          session->banner_TxRx_state = libssh2_NB_state_created;
        }
        *(byte *)&session->socket_block_directions = (byte)session->socket_block_directions & 0xfd;
        sVar6 = (*session->send)(session->socket_fd,
                                 (uchar *)pcVar9 + session->banner_TxRx_total_send,
                                 sVar10 - session->banner_TxRx_total_send,
                                 (uint)((session->flag).sigpipe == 0) << 0xe,&session->abstract);
        if (sVar6 == sVar10 - session->banner_TxRx_total_send) {
          session->banner_TxRx_state = libssh2_NB_state_idle;
          lVar7 = 0;
          iVar4 = 0;
LAB_00112338:
          session->banner_TxRx_total_send = lVar7;
        }
        else {
          if (sVar6 < 0 && sVar6 != -0xb) {
            session->banner_TxRx_state = libssh2_NB_state_idle;
            iVar4 = -0x2b;
            lVar7 = 0;
            goto LAB_00112338;
          }
          session->socket_block_directions = 2;
          if (0 < sVar6) {
            lVar7 = session->banner_TxRx_total_send + sVar6;
            iVar4 = -0x25;
            goto LAB_00112338;
          }
          iVar4 = -0x25;
        }
        if (iVar4 != -0x25) {
          if (iVar4 != 0) {
            pcVar9 = "Failed sending banner";
            goto LAB_00112792;
          }
          session->startup_state = libssh2_NB_state_sent;
          session->banner_TxRx_state = libssh2_NB_state_idle;
          goto LAB_00112368;
        }
      }
      else {
LAB_00112368:
        if (session->startup_state == libssh2_NB_state_sent) {
          do {
            if (session->banner_TxRx_state == libssh2_NB_state_idle) {
              puVar1 = (session->remote).banner;
              if (puVar1 != (uchar *)0x0) {
                (*session->free)(puVar1,&session->abstract);
              }
              (session->remote).banner = (uchar *)0x0;
              session->banner_TxRx_state = libssh2_NB_state_created;
              uVar8 = 0;
            }
            else {
              uVar8 = session->banner_TxRx_total_send;
            }
            local_75 = '\0';
            *(byte *)&session->socket_block_directions =
                 (byte)session->socket_block_directions & 0xfe;
            sVar6 = (*session->recv)(session->socket_fd,&local_75,1,
                                     (uint)((session->flag).sigpipe == 0) << 0xe,&session->abstract)
            ;
            if (sVar6 < 0) {
              if (sVar6 == -0xb) {
                session->socket_block_directions = 1;
                session->banner_TxRx_total_send = uVar8;
                iVar4 = -0x25;
              }
              else {
                session->banner_TxRx_state = libssh2_NB_state_idle;
                session->banner_TxRx_total_send = 0;
                iVar4 = -0x2b;
              }
            }
            else if (sVar6 == 0) {
              session->socket_state = -1;
              iVar4 = -0xd;
            }
            else {
              if ((uVar8 == 0 && (local_75 == '\n' || local_75 == '\r')) &&
                 ((session->remote).banner == (uchar *)0x0)) {
                uVar8 = 3;
LAB_00112500:
                iVar4 = (*(code *)(&DAT_00126bd8 + *(int *)(&DAT_00126bd8 + uVar8 * 4)))();
                return iVar4;
              }
              if (local_75 != '\0') {
                if (0xff < uVar8) {
                  iVar4 = collect_remote_banner(session,uVar8);
                  if (iVar4 < 0) {
                    uVar8 = 1;
                    goto LAB_00112500;
                  }
                  uVar8 = 0;
                }
                session->banner_TxRx_banner[uVar8] = local_75;
                uVar8 = (ulong)((uint)(local_75 == '\n') * 2);
                goto LAB_00112500;
              }
              session->banner_TxRx_state = libssh2_NB_state_idle;
              session->banner_TxRx_total_send = 0;
              iVar4 = -2;
            }
            if (iVar4 != 0) {
              if (iVar4 == -0x25) goto LAB_0011279a;
              pcVar9 = "Failed getting banner";
              goto LAB_00112792;
            }
            iVar4 = strncmp("SSH-",(char *)(session->remote).banner,4);
          } while (iVar4 != 0);
          session->startup_state = libssh2_NB_state_sent1;
        }
        if (session->startup_state == libssh2_NB_state_sent1) {
          iVar4 = _libssh2_kex_exchange(session,0,local_40);
          if (iVar4 == -0x25) goto LAB_0011279a;
          if (iVar4 != 0) {
            pcVar9 = "Unable to exchange encryption keys";
            goto LAB_00112792;
          }
          session->startup_state = libssh2_NB_state_sent2;
        }
        if (session->startup_state == libssh2_NB_state_sent2) {
          session->startup_service[0] = '\x05';
          _libssh2_htonu32(local_48,0xc);
          builtin_memcpy(local_50,"ssh-userauth",0xc);
          session->startup_state = libssh2_NB_state_sent3;
        }
        if (session->startup_state == libssh2_NB_state_sent3) {
          iVar4 = _libssh2_transport_send(session,local_58,0x11,(uchar *)0x0,0);
          if (iVar4 == -0x25) goto LAB_0011279a;
          if (iVar4 != 0) {
            pcVar9 = "Unable to ask for ssh-userauth service";
            goto LAB_00112792;
          }
          session->startup_state = libssh2_NB_state_sent4;
        }
        psVar2 = local_60;
        iVar4 = -0x22;
        if (session->startup_state == libssh2_NB_state_sent4) {
          iVar4 = _libssh2_packet_require
                            (session,'\x06',local_70,local_60,0,(uchar *)0x0,0,local_68);
          if (iVar4 == 0) {
            if (*psVar2 < 5) {
              iVar4 = -0xe;
              pcVar9 = "Unexpected packet length";
            }
            else {
              uVar5 = _libssh2_ntohu32(session->startup_data + 1);
              session->startup_service_length = (ulong)uVar5;
              if (uVar5 == 0xc) {
                puVar1 = *local_70;
                iVar4 = strncmp("ssh-userauth",(char *)(puVar1 + 5),0xc);
                if (iVar4 == 0) {
                  (*session->free)(puVar1,&session->abstract);
                  session->startup_data = (uchar *)0x0;
                  session->startup_state = libssh2_NB_state_idle;
                  iVar4 = 0;
                  goto LAB_0011279a;
                }
              }
              (*session->free)(session->startup_data,&session->abstract);
              session->startup_data = (uchar *)0x0;
              iVar4 = -0xe;
              pcVar9 = "Invalid response received from server";
            }
          }
          else {
            pcVar9 = "Failed to get response to ssh-userauth request";
          }
          goto LAB_00112792;
        }
      }
    }
LAB_0011279a:
    if (iVar4 != -0x25) {
      return iVar4;
    }
    if (session->api_block_mode == 0) {
      return -0x25;
    }
    iVar4 = _libssh2_wait_socket(session,local_38);
    if (iVar4 != 0) {
      return iVar4;
    }
  } while( true );
}

Assistant:

LIBSSH2_API int
libssh2_session_handshake(LIBSSH2_SESSION *session, libssh2_socket_t sock)
{
    int rc;

    BLOCK_ADJUST(rc, session, session_startup(session, sock));

    return rc;
}